

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUIFileOpenDialog::pathToStringW(CGUIFileOpenDialog *this,stringw *result,path *p)

{
  ulong uVar1;
  size_t sVar2;
  ulong __n;
  
  uVar1 = (p->str)._M_string_length;
  __n = uVar1 & 0xffffffff;
  if (__n != 0) {
    ::std::__cxx11::wstring::resize((ulong)result,(int)uVar1 + L'\x01');
    sVar2 = mbstowcs((result->str)._M_dataplus._M_p,(p->str)._M_dataplus._M_p,__n);
    if (sVar2 != 0xffffffffffffffff) {
      ::std::__cxx11::wstring::resize((ulong)result,(wchar_t)sVar2);
      return;
    }
  }
  core::string<wchar_t>::clear(result,true);
  return;
}

Assistant:

void CGUIFileOpenDialog::pathToStringW(irr::core::stringw &result, const irr::io::path &p)
{
	core::multibyteToWString(result, p);
}